

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIFileOpenDialog::sendSelectedEvent(CGUIFileOpenDialog *this,EGUI_EVENT_TYPE type)

{
  long in_RDI;
  SEvent event;
  undefined4 local_48 [4];
  undefined8 local_38;
  
  local_48[0] = 0;
  local_38 = 0;
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),local_48);
  return;
}

Assistant:

void CGUIFileOpenDialog::sendSelectedEvent(EGUI_EVENT_TYPE type)
{
	SEvent event;
	event.EventType = EET_GUI_EVENT;
	event.GUIEvent.Caller = this;
	event.GUIEvent.Element = 0;
	event.GUIEvent.EventType = type;
	Parent->OnEvent(event);
}